

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O3

int is_prime(uint64_t n)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint local_54;
  
  if (n == 1 || (n & 1) == 0) {
    local_54 = (uint)(n == 2);
  }
  else {
    uVar1 = n - 1;
    uVar10 = 2;
    lVar17 = -1;
    do {
      lVar16 = lVar17;
      uVar9 = uVar10;
      lVar17 = lVar16 + 1;
      uVar10 = uVar9 * 2;
    } while ((uVar9 * 2 - 1 & uVar1) == 0);
    lVar11 = 0;
    do {
      uVar10 = (&DAT_00102070)[lVar11];
      local_54 = 1;
      if (n <= uVar10) {
        return 1;
      }
      if (uVar9 <= uVar1) {
        uVar12 = 1;
        uVar14 = uVar1 / uVar9;
        do {
          if ((uVar14 & 1) != 0) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar10;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar12;
            uVar12 = __umodti3(SUB168(auVar3 * auVar6,0),SUB168(auVar3 * auVar6,8),n,0);
          }
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar10;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar10;
          uVar10 = __umodti3(SUB168(auVar4 * auVar7,0),SUB168(auVar4 * auVar7,8),n,0);
          bVar2 = 1 < uVar14;
          uVar14 = uVar14 >> 1;
        } while (bVar2);
        if (uVar12 != uVar1 && uVar12 != 1) {
          if (lVar16 + 2U < 2) {
            lVar15 = 0;
          }
          else {
            lVar15 = 0;
            lVar13 = lVar17;
            do {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = uVar12;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uVar12;
              uVar12 = __umodti3(SUB168(auVar5 * auVar8,0),SUB168(auVar5 * auVar8,8),n,0);
              lVar15 = lVar15 + (ulong)(uVar1 != uVar12);
              lVar13 = lVar13 + -1;
            } while (lVar13 != 0);
          }
          if (lVar15 == lVar17) {
            return 0;
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 7);
  }
  return local_54;
}

Assistant:

int is_prime(uint64_t n) {
    if(n % 2 == 0 || n == 1)
        return n == 2 ? 1 : 0;

    // perform (deterministic) Miller-Rabin primality test

    uint64_t s = 1;
    uint64_t t = 2;
    while((n-1) % (t<<1) == 0) {
        s++;
        t <<= 1;
    }
    uint64_t d = (n-1) / t;

    // these bases should be sufficient to test all n < 2^64
    uint64_t bases[] = {2, 325, 9375, 28178, 450775, 9780504, 1795265022};

    for(size_t i = 0; i < 7; i++) {
        uint64_t a = bases[i];
        if(a >= n)
            break;

        uint64_t tmp = expmod(a, d, n);
        if(tmp != 1 && tmp != n-1) {
            size_t cnt = 0;
            for(uint64_t r = 1; r < s; r++) {
                tmp = mulmod(tmp, tmp, n);
                if(tmp != n-1)
                    cnt++;
            }
            if(cnt == s-1)
                return 0;
        }

    }

    return 1;
}